

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x1_010.c
# Opt level: O0

void seta_update(void *param,UINT32 samples,DEV_SMPL **outputs)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  char cVar4;
  ushort uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  DEV_SMPL *pDVar10;
  DEV_SMPL *pDVar11;
  long lVar12;
  uint uVar13;
  byte *pbVar14;
  long lVar15;
  bool bVar16;
  int vol;
  DEV_SMPL *bufR;
  DEV_SMPL *bufL;
  UINT32 delta;
  UINT32 env_step;
  UINT32 env_offs;
  UINT32 smp_step;
  UINT32 smp_offs;
  UINT8 *env;
  INT8 data;
  INT8 *end;
  INT8 *start;
  int div;
  int freq;
  int volR;
  int volL;
  UINT32 i;
  UINT32 ch;
  X1_010_CHANNEL *reg;
  x1_010_state *info;
  DEV_SMPL **outputs_local;
  UINT32 samples_local;
  void *param_local;
  
  pDVar10 = *outputs;
  pDVar11 = outputs[1];
  memset(*outputs,0,(ulong)samples << 2);
  memset(outputs[1],0,(ulong)samples << 2);
  volL = 0;
  do {
    if (0xf < (uint)volL) {
      return;
    }
    pbVar14 = (byte *)((long)param + (ulong)(uint)volL * 8 + 0x1c);
    if (((*pbVar14 & 1) != 0) && (*(char *)((long)param + (ulong)(uint)volL + 0x20a0) == '\0')) {
      bVar16 = (*pbVar14 & 0x80) != 0;
      if ((*pbVar14 & 2) == 0) {
        lVar15 = *(long *)((long)param + 0x10) + (long)(int)((uint)pbVar14[4] << 0xc);
        lVar12 = *(long *)((long)param + 0x10);
        bVar1 = pbVar14[5];
        bVar2 = pbVar14[1];
        bVar3 = pbVar14[1];
        env_offs = *(UINT32 *)((long)param + (ulong)(uint)volL * 4 + 0x201c);
        start._4_4_ = (int)(uint)pbVar14[2] >> bVar16;
        if (start._4_4_ == 0) {
          start._4_4_ = 4;
        }
        uVar6 = *(uint *)((long)param + 0x209c);
        uVar7 = *(uint *)((long)param + 0x18);
        for (volR = 0; (uint)volR < samples; volR = volR + 1) {
          if ((ulong)(lVar12 + (int)((0x100 - (uint)bVar1) * 0x1000)) <=
              lVar15 + (ulong)(env_offs >> 0xe)) {
            *pbVar14 = *pbVar14 & 0xfe;
            break;
          }
          cVar4 = *(char *)(lVar15 + (ulong)(env_offs >> 0xe));
          pDVar10[(uint)volR] =
               ((int)cVar4 * ((int)(uint)bVar2 >> 4) * 0x222) / 0x100 + pDVar10[(uint)volR];
          pDVar11[(uint)volR] =
               (int)((int)cVar4 * (bVar3 & 0xf) * 0x222) / 0x100 + pDVar11[(uint)volR];
          env_offs = (int)(long)(((float)uVar6 * 0.00012207031 * (float)start._4_4_ * 16384.0) /
                                 (float)uVar7 + 0.5) + env_offs;
        }
        *(UINT32 *)((long)param + (ulong)(uint)volL * 4 + 0x201c) = env_offs;
      }
      else {
        bVar1 = pbVar14[1];
        env_offs = *(UINT32 *)((long)param + (ulong)(uint)volL * 4 + 0x201c);
        uVar5 = *(ushort *)(pbVar14 + 2);
        uVar6 = *(uint *)((long)param + 0x209c);
        uVar7 = *(uint *)((long)param + 0x18);
        bVar2 = pbVar14[5];
        delta = *(UINT32 *)((long)param + (ulong)(uint)volL * 4 + 0x205c);
        uVar8 = *(uint *)((long)param + 0x209c);
        bVar3 = pbVar14[4];
        uVar9 = *(uint *)((long)param + 0x18);
        for (volR = 0; (uint)volR < samples; volR = volR + 1) {
          if (((*pbVar14 & 4) != 0) && (0x7f < delta >> 0x10)) {
            *pbVar14 = *pbVar14 & 0xfe;
            break;
          }
          uVar13 = (uint)*(byte *)((long)param +
                                  (ulong)(delta >> 0x10 & 0x7f) + (ulong)bVar2 * 0x80 + 0x1c);
          cVar4 = *(char *)((long)param +
                           (ulong)(env_offs >> 0xe & 0x7f) + (ulong)bVar1 * 0x80 + 0x101c);
          pDVar10[(uint)volR] =
               ((int)cVar4 * ((int)uVar13 >> 4) * 0x222) / 0x100 + pDVar10[(uint)volR];
          pDVar11[(uint)volR] =
               (int)((int)cVar4 * (uVar13 & 0xf) * 0x222) / 0x100 + pDVar11[(uint)volR];
          env_offs = (int)(long)(((float)uVar6 * 0.0078125 * 0.0009765625 * 0.25 *
                                  (float)(uVar5 >> bVar16) * 16384.0) / (float)uVar7 + 0.5) +
                     env_offs;
          delta = (int)(long)(((float)uVar8 * 0.0078125 * 0.0009765625 * 0.25 * (float)bVar3 *
                              65536.0) / (float)uVar9 + 0.5) + delta;
        }
        *(UINT32 *)((long)param + (ulong)(uint)volL * 4 + 0x201c) = env_offs;
        *(UINT32 *)((long)param + (ulong)(uint)volL * 4 + 0x205c) = delta;
      }
    }
    volL = volL + 1;
  } while( true );
}

Assistant:

static void seta_update(void *param, UINT32 samples, DEV_SMPL **outputs)
{
	x1_010_state *info = (x1_010_state *)param;
	X1_010_CHANNEL  *reg;
	UINT32  ch;
	UINT32  i;
	int     volL, volR, freq, div;
	INT8    *start, *end, data;
	UINT8   *env;
	UINT32  smp_offs, smp_step, env_offs, env_step, delta;
	DEV_SMPL *bufL = outputs[0];
	DEV_SMPL *bufR = outputs[1];

	// mixer buffer zero clear
	memset( outputs[0], 0, samples*sizeof(*outputs[0]) );
	memset( outputs[1], 0, samples*sizeof(*outputs[1]) );

//	if( info->sound_enable == 0 ) return;

	for( ch = 0; ch < SETA_NUM_CHANNELS; ch++ ) {
		reg = (X1_010_CHANNEL *)&(info->reg[ch*sizeof(X1_010_CHANNEL)]);
		if( (reg->status&1) != 0 && ! info->Muted[ch]) {        // Key On
			div = (reg->status&0x80) ? 1 : 0;
			if( (reg->status&2) == 0 ) {                        // PCM sampling
				start    = (INT8 *)(info->rom + reg->start*0x1000);
				end      = (INT8 *)(info->rom + (0x100-reg->end)*0x1000);
				volL     = ((reg->volume>>4)&0xf)*VOL_BASE;
				volR     = ((reg->volume>>0)&0xf)*VOL_BASE;
				smp_offs = info->smp_offset[ch];
				freq     = reg->frequency>>div;
				// Meta Fox does write the frequency register, but this is a hack to make it "work" with the current setup
				// This is broken for Arbalester (it writes 8), but that'll be fixed later.
				if( freq == 0 ) freq = 4;
				smp_step = (UINT32)((float)info->base_clock/8192.0f
							*freq*(1<<FREQ_BASE_BITS)/(float)info->rate+0.5f);
				if( smp_offs == 0 ) {
					LOG_SOUND(( "Play sample %p - %p, channel %X volume %d:%d freq %X step %X offset %X\n",
						start, end, ch, volL, volR, freq, smp_step, smp_offs ));
				}
				for( i = 0; i < samples; i++ ) {
					delta = smp_offs>>FREQ_BASE_BITS;
					// sample ended?
					if( start+delta >= end ) {
						reg->status &= ~0x01;                   // Key off
						break;
					}
					data = start[delta];
					bufL[i] += (data*volL/256);
					bufR[i] += (data*volR/256);
					smp_offs += smp_step;
				}
				info->smp_offset[ch] = smp_offs;
			} else {                                            // Wave form
				start    = (INT8 *)&(info->reg[reg->volume*128+0x1000]);
				smp_offs = info->smp_offset[ch];
				freq     = ((reg->pitch_hi<<8)+reg->frequency)>>div;
				smp_step = (UINT32)((float)info->base_clock/128.0/1024.0/4.0*freq*(1<<FREQ_BASE_BITS)/(float)info->rate+0.5f);

				env      = (UINT8 *)&(info->reg[reg->end*128]);
				env_offs = info->env_offset[ch];
				env_step = (UINT32)((float)info->base_clock/128.0/1024.0/4.0*reg->start*(1<<ENV_BASE_BITS)/(float)info->rate+0.5f);
				/* Print some more debug info */
				if( smp_offs == 0 ) {
					LOG_SOUND(( "Play waveform %X, channel %X volume %X freq %4X step %X offset %X\n",
						reg->volume, ch, reg->end, freq, smp_step, smp_offs ));
				}
				for( i = 0; i < samples; i++ ) {
					int vol;
					delta = env_offs>>ENV_BASE_BITS;
					// Envelope one shot mode
					if( (reg->status&4) != 0 && delta >= 0x80 ) {
						reg->status &= ~0x01;                   // Key off
						break;
					}
					vol = env[delta&0x7f];
					volL = ((vol>>4)&0xf)*VOL_BASE;
					volR = ((vol>>0)&0xf)*VOL_BASE;
					data  = start[(smp_offs>>FREQ_BASE_BITS)&0x7f];
					bufL[i] += (data*volL/256);
					bufR[i] += (data*volR/256);
					smp_offs += smp_step;
					env_offs += env_step;
				}
				info->smp_offset[ch] = smp_offs;
				info->env_offset[ch] = env_offs;
			}
		}
	}
}